

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cpp
# Opt level: O1

vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *
lookup(vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *__return_storage_ptr__,
      string_view symbol,Search_type st)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  _Alloc_hider _Var3;
  pointer ppVar4;
  pointer ppVar5;
  int iVar6;
  ulong uVar7;
  size_type sVar8;
  size_t __n;
  initializer_list<Symbol_lib_entry> __l;
  File_content_iterator pos;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  Symbol_lib_entry value;
  allocator_type local_2a9;
  File_content_iterator local_2a8;
  size_t local_2a0;
  char *local_298;
  Symbol_lib_entry local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  Symbol_lib_entry local_238 [9];
  
  local_298 = symbol._M_str;
  local_2a0 = symbol._M_len;
  local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (File_index_t *)0x0;
  local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238[0].entry._M_dataplus._M_p = (pointer)&local_238[0].entry.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,data_base_index_filepath_abi_cxx11_._M_dataplus._M_p,
             data_base_index_filepath_abi_cxx11_._M_dataplus._M_p +
             data_base_index_filepath_abi_cxx11_._M_string_length);
  uVar7 = boost::filesystem::detail::file_size((path *)local_238,(error_code *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0].entry._M_dataplus._M_p != &local_238[0].entry.field_2) {
    operator_delete(local_238[0].entry._M_dataplus._M_p,
                    CONCAT71(local_238[0].entry.field_2._M_allocated_capacity._1_7_,
                             local_238[0].entry.field_2._M_local_buf[0]) + 1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_258,uVar7 >> 2 & 0x3fffffff);
  std::ifstream::ifstream(local_238,(string *)&data_base_index_filepath_abi_cxx11_,_S_in|_S_bin);
  std::istream::read((char *)local_238,
                     (long)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  if ((*(byte *)((long)&local_238[0].lib_pos.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                *(long *)(local_238[0].entry._M_dataplus._M_p + -0x18)) & 5) != 0) {
    __assert_fail("index_file",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/lookup.cpp"
                  ,0x7f,"std::vector<Symbol_lib_entry> lookup(string_view, Search_type)");
  }
  std::ifstream::~ifstream(local_238);
  std::ifstream::open((string *)File_content_iterator::file,0x12e7b0);
  puVar2 = local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_2a8 = std::
              __lower_bound<File_content_iterator,std::experimental::fundamentals_v1::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_less_val>
                        (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_2a0);
  if (local_2a8.file_position == puVar2) {
    (__return_storage_ptr__->super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    File_content_iterator::get_element(local_238,&local_2a8);
    ppVar4 = local_238[0].lib_pos.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    _Var3._M_p = local_238[0].entry._M_dataplus._M_p;
    if (st == exact) {
      __n = (long)(local_238[0].lib_pos.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->first - 1;
      if ((local_2a0 == __n) &&
         (((int)__n == 0 ||
          (iVar6 = bcmp(local_238[0].entry._M_dataplus._M_p,local_298,__n), iVar6 == 0)))) {
        paVar1 = &local_290.entry.field_2;
        local_238[0].entry._M_dataplus._M_p = (pointer)&local_238[0].entry.field_2;
        if (_Var3._M_p == local_238[0].entry._M_dataplus._M_p) {
          local_290.entry.field_2._8_8_ = local_238[0].entry.field_2._8_8_;
          local_290.entry._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_290.entry._M_dataplus._M_p = _Var3._M_p;
        }
        local_290.entry.field_2._M_allocated_capacity._1_7_ =
             local_238[0].entry.field_2._M_allocated_capacity._1_7_;
        local_290.entry.field_2._M_local_buf[0] = local_238[0].entry.field_2._M_local_buf[0];
        local_290.entry._M_string_length = local_238[0].entry._M_string_length;
        local_238[0].entry._M_string_length = 0;
        local_238[0].entry.field_2._M_local_buf[0] = '\0';
        local_290.lib_pos.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start = ppVar4;
        local_290.lib_pos.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_238[0].lib_pos.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_290.lib_pos.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_238[0].lib_pos.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_238[0].lib_pos.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_238[0].lib_pos.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_238[0].lib_pos.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        __l._M_len = 1;
        __l._M_array = &local_290;
        std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::vector
                  (__return_storage_ptr__,__l,&local_2a9);
        if (local_290.lib_pos.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_290.lib_pos.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_290.lib_pos.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_290.lib_pos.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290.entry._M_dataplus._M_p != paVar1) {
          operator_delete(local_290.entry._M_dataplus._M_p,
                          local_290.entry.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        (__return_storage_ptr__->
        super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
    }
    else {
      (__return_storage_ptr__->
      super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_290.entry._M_dataplus._M_p =
           (pointer)((long)(local_238[0].lib_pos.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first + -1);
      local_290.entry._M_string_length = (size_type)local_238[0].entry._M_dataplus._M_p;
      sVar8 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              find((basic_string_view<char,_std::char_traits<char>_> *)&local_290,local_298,0,
                   local_2a0);
      if (sVar8 == 0) {
        do {
          std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::
          emplace_back<Symbol_lib_entry>(__return_storage_ptr__,local_238);
          local_2a8.file_position = local_2a8.file_position + 1;
          if (local_2a8.file_position == puVar2) break;
          File_content_iterator::get_element(&local_290,&local_2a8);
          std::__cxx11::string::operator=((string *)local_238,(string *)&local_290);
          ppVar5 = local_238[0].lib_pos.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = local_238[0].lib_pos.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_238[0].lib_pos.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_290.lib_pos.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_238[0].lib_pos.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_290.lib_pos.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_238[0].lib_pos.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_290.lib_pos.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_290.lib_pos.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_290.lib_pos.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_290.lib_pos.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (ppVar4 != (pointer)0x0) {
            operator_delete(ppVar4,(long)ppVar5 - (long)ppVar4);
          }
          if (local_290.lib_pos.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_290.lib_pos.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_290.lib_pos.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_290.lib_pos.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290.entry._M_dataplus._M_p != &local_290.entry.field_2) {
            operator_delete(local_290.entry._M_dataplus._M_p,
                            local_290.entry.field_2._M_allocated_capacity + 1);
          }
          local_290.entry._M_dataplus._M_p =
               (pointer)((long)(local_238[0].lib_pos.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + -1);
          local_290.entry._M_string_length = (size_type)local_238[0].entry._M_dataplus._M_p;
          sVar8 = std::experimental::fundamentals_v1::
                  basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_290,
                             local_298,0,local_2a0);
        } while (sVar8 == 0);
      }
    }
    if (local_238[0].lib_pos.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238[0].lib_pos.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_238[0].lib_pos.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_238[0].lib_pos.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0].entry._M_dataplus._M_p != &local_238[0].entry.field_2) {
      operator_delete(local_238[0].entry._M_dataplus._M_p,
                      CONCAT71(local_238[0].entry.field_2._M_allocated_capacity._1_7_,
                               local_238[0].entry.field_2._M_local_buf[0]) + 1);
    }
  }
  std::ifstream::close();
  if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Symbol_lib_entry> lookup(string_view symbol, Search_type st) {
	std::vector<File_index_t> indexes;
	{
		File_index_t index_size = boost::filesystem::file_size(data_base_index_filepath);
		indexes.resize(index_size / sizeof(File_index_t));
		std::ifstream index_file(data_base_index_filepath, std::ios_base::in | std::ios::binary);
		index_file.read(any_cast<char *>(indexes.data()), index_size);
		assert(index_file);
	}
	File_content_iterator::file.open(data_base_filepath, std::ios_base::in | std::ios::binary);
	ON_SCOPE_EXIT(File_content_iterator::file.close(););

	//TODO: replace lower_bound with binary_interpolation_search
	auto index_begin = indexes.data();
	auto index_end = indexes.data() + indexes.size();
	auto pos = std::lower_bound(File_content_iterator{index_begin}, File_content_iterator{index_end}, symbol);
	if (pos.file_position == index_end) {
		return {};
	};
	auto value = pos.get_element();
	if (st == Search_type::exact) {
		if (value.get_symbol() == symbol) {
			return {std::move(value)};
		};
		return {};
	}
	std::vector<Symbol_lib_entry> retval;
	while (value.get_symbol().find(symbol) == 0) {
		retval.push_back(std::move(value));
		++pos;
		if (pos.file_position == index_end) {
			return retval;
		}
		value = pos.get_element();
	}
	return retval;
}